

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O3

int ya_getopt_internal(int argc,char **argv,char *optstring,option *longopts,int *longindex,
                      int long_only)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  char **ppcVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  char cVar14;
  ulong uVar15;
  int long_only_flag;
  int local_34;
  
  if (ya_optopt == 0x3f) {
    ya_optopt = 0;
  }
  cVar14 = *optstring;
  if (posixly_correct == -1) {
    uVar11 = 1;
    if (cVar14 != '+') {
      pcVar7 = getenv("POSIXLY_CORRECT");
      uVar11 = (uint)(pcVar7 != (char *)0x0);
    }
    handle_nonopt_argv = cVar14 == '-';
    posixly_correct = uVar11;
  }
  if (ya_optind == 0) {
    uVar11 = 1;
    if (cVar14 != '+') {
      pcVar7 = getenv("POSIXLY_CORRECT");
      uVar11 = (uint)(pcVar7 != (char *)0x0);
    }
    handle_nonopt_argv = cVar14 == '-';
    ya_optind = 1;
    ya_optnext = (char *)0x0;
    cVar14 = *optstring;
    posixly_correct = uVar11;
  }
  pcVar7 = ya_optnext;
  iVar6 = posixly_correct;
  if ((cVar14 == '-') || (cVar14 == '+')) {
    optstring = optstring + 1;
  }
  iVar10 = ya_optind;
  if (ya_getopt_internal::start != 0 && ya_optnext == (char *)0x0) {
    iVar4 = (ya_optind + ya_getopt_internal::start) - ya_getopt_internal::end;
    iVar10 = 1;
    if (1 < iVar4) {
      iVar10 = iVar4;
    }
    if (ya_getopt_internal::start < ya_getopt_internal::end) {
      lVar12 = (long)(ya_optind + -1);
      lVar1 = lVar12 + 1;
      uVar13 = (long)ya_getopt_internal::end - 1;
      ppcVar9 = argv;
      iVar4 = ya_optind;
      ya_optind = iVar10;
      do {
        iVar4 = iVar4 + -1;
        pcVar2 = argv[uVar13];
        iVar5 = (int)uVar13;
        lVar8 = (long)ya_getopt_internal::end;
        if ((long)uVar13 < (long)iVar4) {
          do {
            ppcVar9[lVar8 + -1] = ppcVar9[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar1 != lVar8);
          iVar5 = (int)lVar12;
        }
        argv[iVar5] = pcVar2;
        uVar15 = uVar13 - 1;
        lVar12 = lVar12 + -1;
        ppcVar9 = ppcVar9 + -1;
        bVar3 = (long)ya_getopt_internal::start < (long)uVar13;
        uVar13 = uVar15;
      } while (bVar3);
    }
    else {
      uVar15 = (ulong)(ya_getopt_internal::end - 1);
      ya_optind = iVar10;
    }
    ya_getopt_internal::end = (int)uVar15;
    ya_getopt_internal::start = 0;
  }
  if (argc <= iVar10) {
    ya_optarg = (char *)0x0;
    return -1;
  }
  if (pcVar7 != (char *)0x0) goto LAB_0010340c;
  pcVar7 = argv[iVar10];
  if ((*pcVar7 == '-') && (iVar4 = iVar10, pcVar7[1] != '\0')) {
LAB_0010346c:
    if ((pcVar7[1] == '-') && (pcVar7[2] == '\0')) {
      ya_optind = iVar4 + 1;
      return -1;
    }
  }
  else {
    if (handle_nonopt_argv == '\x01') {
      ya_optind = iVar10 + 1;
      ya_optarg = pcVar7;
      ya_getopt_internal::start = 0;
      return 1;
    }
    if (iVar6 != 0) {
      ya_optarg = (char *)0x0;
      return -1;
    }
    iVar4 = iVar10 + 1;
    iVar6 = ya_getopt_internal::end;
    if (iVar4 < argc) {
      ppcVar9 = argv + iVar4;
      while ((**ppcVar9 != '-' || (iVar6 = iVar4, (*ppcVar9)[1] == '\0'))) {
        iVar4 = iVar4 + 1;
        ppcVar9 = ppcVar9 + 1;
        if (argc == iVar4) {
          ya_optarg = (char *)0x0;
          ya_getopt_internal::start = iVar10;
          return -1;
        }
      }
    }
    ya_getopt_internal::end = iVar6;
    if (iVar4 == argc) {
      ya_optarg = (char *)0x0;
      ya_getopt_internal::start = iVar10;
      return -1;
    }
    pcVar7 = argv[iVar4];
    ya_optind = iVar4;
    ya_getopt_internal::start = iVar10;
    if (*pcVar7 == '-') goto LAB_0010346c;
  }
  if ((longopts != (option *)0x0) && (pcVar7[1] == '-')) {
    iVar6 = ya_getopt_longopts(argc,argv,pcVar7 + 2,optstring,longopts,longindex,(int *)0x0);
    return iVar6;
  }
  pcVar7 = argv[iVar4] + 1;
  ya_optnext = pcVar7;
LAB_0010340c:
  if (long_only == 0) {
    iVar6 = ya_getopt_shortopts(argc,argv,optstring,0);
    return iVar6;
  }
  local_34 = 0;
  iVar6 = ya_getopt_longopts(argc,argv,pcVar7,optstring,longopts,longindex,&local_34);
  if (local_34 != 0) {
    iVar6 = ya_getopt_shortopts(argc,argv,optstring,1);
    return iVar6;
  }
  ya_optnext = (char *)0x0;
  return iVar6;
}

Assistant:

static int ya_getopt_internal(int argc, char * const argv[], const char *optstring, const struct option *longopts, int *longindex, int long_only)
{
    static int start, end;

    if (ya_optopt == '?') {
        ya_optopt = 0;
    }

    if (posixly_correct == -1) {
        check_gnu_extension(optstring);
    }

    if (ya_optind == 0) {
        check_gnu_extension(optstring);
        ya_optind = 1;
        ya_optnext = NULL;
    }

    switch (optstring[0]) {
    case '+':
    case '-':
        optstring++;
    }

    if (ya_optnext == NULL && start != 0) {
        int last_pos = ya_optind - 1;

        ya_optind -= end - start;
        if (ya_optind <= 0) {
            ya_optind = 1;
        }
        while (start < end--) {
            int i;
            char *arg = argv[end];

            for (i = end; i < last_pos; i++) {
                ((char **)argv)[i] = argv[i + 1];
            }
            ((char const **)argv)[i] = arg;
            last_pos--;
        }
        start = 0;
    }

    if (ya_optind >= argc) {
        ya_optarg = NULL;
        return -1;
    }
    if (ya_optnext == NULL) {
        const char *arg = argv[ya_optind];
        if (!is_option(arg)) {
            if (handle_nonopt_argv) {
                ya_optarg = argv[ya_optind++];
                start = 0;
                return 1;
            } else if (posixly_correct) {
                ya_optarg = NULL;
                return -1;
            } else {
                int i;

                start = ya_optind;
                for (i = ya_optind + 1; i < argc; i++) {
                    if (is_option(argv[i])) {
                        end = i;
                        break;
                    }
                }
                if (i == argc) {
                    ya_optarg = NULL;
                    return -1;
                }
                ya_optind = i;
                arg = argv[ya_optind];
            }
        }
        if (strcmp(arg, "--") == 0) {
            ya_optind++;
            return -1;
        }
        if (longopts != NULL && arg[1] == '-') {
            return ya_getopt_longopts(argc, argv, argv[ya_optind] + 2, optstring, longopts, longindex, NULL);
        }
    }

    if (ya_optnext == NULL) {
        ya_optnext = argv[ya_optind] + 1;
    }
    if (long_only) {
        int long_only_flag = 0;
        int rv = ya_getopt_longopts(argc, argv, ya_optnext, optstring, longopts, longindex, &long_only_flag);
        if (!long_only_flag) {
            ya_optnext = NULL;
            return rv;
        }
    }

    return ya_getopt_shortopts(argc, argv, optstring, long_only);
}